

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_server.c
# Opt level: O0

void ping_written(cio_websocket *websocket,void *handler_context,cio_error err)

{
  cio_error cVar1;
  cio_timer *timer;
  cio_error err_local;
  void *handler_context_local;
  cio_websocket *websocket_local;
  
  if (err == CIO_SUCCESS) {
    cVar1 = cio_timer_expires_from_now((cio_timer *)handler_context,1000000000,send_ping,websocket);
    if (cVar1 != CIO_SUCCESS) {
      fprintf(_stderr,"Could not start ping timer!\n");
      cVar1 = cio_websocket_close(websocket,CIO_WEBSOCKET_CLOSE_NORMAL,(char *)0x0,
                                  (cio_websocket_write_handler_t)0x0,(void *)0x0);
      if (cVar1 != CIO_SUCCESS) {
        fprintf(_stderr,"Could not start writing websocket close!\n");
      }
    }
  }
  else {
    fprintf(_stderr,"writing ping frame failed!\n");
    cVar1 = cio_websocket_close(websocket,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,(char *)0x0,
                                (cio_websocket_write_handler_t)0x0,(void *)0x0);
    if (cVar1 != CIO_SUCCESS) {
      fprintf(_stderr,"Could not start writing websocket close!\n");
    }
  }
  return;
}

Assistant:

static void ping_written(struct cio_websocket *websocket, void *handler_context, enum cio_error err)
{
	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "writing ping frame failed!\n");
		err = cio_websocket_close(websocket, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, NULL, NULL, NULL);
		if (err != CIO_SUCCESS) {
			(void)fprintf(stderr, "Could not start writing websocket close!\n");
		}
	} else {
		struct cio_timer *timer = (struct cio_timer *)handler_context;
		err = cio_timer_expires_from_now(timer, PING_PERIOD_NS, send_ping, websocket);
		if (err != CIO_SUCCESS) {
			(void)fprintf(stderr, "Could not start ping timer!\n");
			err = cio_websocket_close(websocket, CIO_WEBSOCKET_CLOSE_NORMAL, NULL, NULL, NULL);
			if (err != CIO_SUCCESS) {
				(void)fprintf(stderr, "Could not start writing websocket close!\n");
			}
		}
	}
}